

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AddVars(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *this,VarBndVec *lbs,VarBndVec *ubs,VarTypeVec *types)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ValueNode *pVVar4;
  uint uVar5;
  NodeRange NVar6;
  
  FlatModel<mp::DefaultFlatModelParams>::AddVars__basic
            (&this->super_FlatModel<mp::DefaultFlatModelParams>,lbs,ubs,types);
  pVVar4 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                     (&(this->value_presolver_).super_ValuePresolverImpl.dest_.vars_);
  uVar1 = pVVar4->sz_;
  iVar2 = (int)((ulong)((long)(lbs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(lbs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  uVar5 = iVar2 + (int)uVar1;
  uVar3 = (int)uVar1 + 1;
  if (-1 < (int)uVar5) {
    uVar3 = uVar5;
  }
  NVar6.ir_ = (NodeIndexRange)(uVar1 & 0xffffffff | (ulong)uVar3 << 0x20);
  pVVar4->sz_ = (long)iVar2 + uVar1;
  NVar6.pvn_ = pVVar4;
  NVar6 = AutoLink(this,NVar6);
  return NVar6;
}

Assistant:

pre::NodeRange AddVars(const typename BaseFlatModel::VarBndVec& lbs,
               const typename BaseFlatModel::VarBndVec& ubs,
               const typename BaseFlatModel::VarTypeVec& types) {
    assert(0==BaseFlatModel::num_vars());                     // allow this only once
    BaseFlatModel::AddVars__basic(lbs, ubs, types);
    return AutoLink( GetVarValueNode().Add( lbs.size() ) );
  }